

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<float,float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<float,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  float fVar1;
  pointer pfVar2;
  pointer pfVar3;
  Variable<float> *pVVar4;
  pointer pcVar5;
  ostringstream oVar6;
  PrecisionCase *pPVar7;
  bool bVar8;
  ContextType type;
  int iVar9;
  uint uVar10;
  undefined8 uVar11;
  char *__s;
  size_t sVar12;
  long *plVar13;
  ShaderExecutor *pSVar14;
  IVal *pIVar15;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  size_t sVar17;
  IVal IVar18;
  ulong uVar19;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  IVal reference1;
  FuncSet funcs;
  IVal in2;
  IVal in3;
  ostringstream os;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ShaderSpec spec;
  ostringstream oss;
  PrecisionCase *local_4e8;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4e0;
  IVal local_4d1;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4d0;
  FloatFormat *local_4c8;
  undefined1 local_4c0 [8];
  undefined8 local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4b0;
  _Rb_tree_node_base *local_4a0;
  size_t local_498;
  Statement *local_490;
  string local_488;
  size_t local_468;
  ulong local_460;
  IVal local_458;
  undefined1 local_438 [8];
  double dStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_428;
  double local_418;
  Data local_410;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  ulong local_2b8;
  ResultCollector *local_2b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2a8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_278;
  FloatFormat local_248;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  pfVar2 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar17 = (long)pfVar3 - (long)pfVar2 >> 2;
  local_4e0 = variables;
  local_4d0 = inputs;
  local_490 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_278,sVar17);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_248.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_248.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_248.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_248.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_248.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_248.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_248.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_248.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_248._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_4e8 = this;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"Statement: ",0xb);
  (*local_490->_vptr_Statement[2])(local_490,(ostringstream *)&dStack_430);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_4b8 = (double)((ulong)local_4b8._4_4_ << 0x20);
  aStack_4b0._M_allocated_capacity = 0;
  local_498 = 0;
  aStack_4b0._8_8_ = (_Rb_tree_node_base *)&local_4b8;
  local_4a0 = (_Rb_tree_node_base *)&local_4b8;
  local_468 = sVar17;
  (*local_490->_vptr_Statement[4])(local_490,local_4c0);
  if ((_Rb_tree_node_base *)aStack_4b0._8_8_ != (_Rb_tree_node_base *)&local_4b8) {
    uVar11 = aStack_4b0._8_8_;
    do {
      (**(code **)(**(long **)(uVar11 + 0x20) + 0x30))(*(long **)(uVar11 + 0x20),local_1a8);
      uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
    } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&local_4b8);
  }
  if (local_498 != 0) {
    local_438 = (undefined1  [8])((local_4e8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_430,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_430,local_488._M_dataplus._M_p,local_488._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"precision ",10);
  __s = glu::getPrecisionName((local_4e8->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)((long)&local_4e8 + *(long *)((long)local_438 + -0x18)) + 0xb0);
  }
  else {
    sVar12 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,__s,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_4e8->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar20 = local_4e0;
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_4e8->m_extension)._M_string_length != 0) {
    std::operator+(local_1a8,"#extension ",&local_4e8->m_extension);
    plVar13 = (long *)std::__cxx11::string::append((char *)local_1a8);
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar16) {
      aStack_428._M_allocated_capacity = paVar16->_M_allocated_capacity;
      aStack_428._8_8_ = plVar13[3];
      local_438 = (undefined1  [8])&aStack_428;
    }
    else {
      aStack_428._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_438 = (undefined1  [8])*plVar13;
    }
    dStack_430 = (double)plVar13[1];
    *plVar13 = (long)paVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_438);
    if (local_438 != (undefined1  [8])&aStack_428) {
      operator_delete((void *)local_438,aStack_428._M_allocated_capacity + 1);
    }
    pVVar20 = local_4e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),2);
  makeSymbol<float>((Symbol *)local_438,local_4e8,
                    (pVVar20->in1).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_438);
  glu::VarType::operator=(&((pointer)(uVar11 + 0x38))->varType,(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  pVVar20 = local_4e0;
  if (local_438 != (undefined1  [8])&aStack_428) {
    operator_delete((void *)local_438,aStack_428._M_allocated_capacity + 1);
  }
  makeSymbol<float>((Symbol *)local_438,local_4e8,
                    (pVVar20->in0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])&aStack_428) {
    operator_delete((void *)local_438,aStack_428._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),1);
  makeSymbol<float>((Symbol *)local_438,local_4e8,
                    (local_4e0->out0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])&aStack_428) {
    operator_delete((void *)local_438,aStack_428._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  (*local_490->_vptr_Statement[2])(local_490,local_438);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  pPVar7 = local_4e8;
  pSVar14 = ShaderExecUtil::createExecutor
                      ((local_4e8->m_ctx).renderContext,(local_4e8->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  sVar17 = local_468;
  local_438 = (undefined1  [8])
              (local_4d0->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  dStack_430 = (double)(local_4d0->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
  aStack_428._M_allocated_capacity =
       (size_type)
       (local_4d0->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  aStack_428._8_8_ =
       (local_4d0->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8[0]._M_dataplus._M_p =
       (pointer)local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1a8[0]._M_string_length =
       (size_type)
       local_278.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar14->_vptr_ShaderExecutor[3])
            (pSVar14,((pPVar7->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar9 = (*pSVar14->_vptr_ShaderExecutor[2])(pSVar14);
  if ((char)iVar9 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar14->_vptr_ShaderExecutor[5])(pSVar14);
  (*pSVar14->_vptr_ShaderExecutor[6])(pSVar14,sVar17 & 0xffffffff,local_438,local_1a8);
  (*pSVar14->_vptr_ShaderExecutor[1])(pSVar14);
  pVVar20 = local_4e0;
  local_438 = (undefined1  [8])((ulong)local_438 & 0xffffffffffffff00);
  dStack_430 = INFINITY;
  aStack_428._M_allocated_capacity = 0xfff0000000000000;
  local_1a8[0]._M_dataplus._M_p = local_1a8[0]._M_dataplus._M_p & 0xffffffffffffff00;
  local_1a8[0]._M_string_length = 0x7ff0000000000000;
  local_1a8[0].field_2._M_allocated_capacity = -INFINITY;
  local_4c0[0] = false;
  local_4b8 = INFINITY;
  aStack_4b0._M_allocated_capacity = 0xfff0000000000000;
  Environment::bind<float>
            ((Environment *)&local_2a8,
             (local_4e0->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_438);
  Environment::bind<float>
            ((Environment *)&local_2a8,
             (pVVar20->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2a8,
             (pVVar20->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_488);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2a8,
             (pVVar20->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_458);
  Environment::bind<float>
            ((Environment *)&local_2a8,
             (pVVar20->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_4c0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2a8,
             (pVVar20->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_4d1);
  if (pfVar3 == pfVar2) {
LAB_007b4a15:
    local_438 = (undefined1  [8])((local_4e8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4c8 = &(local_4e8->m_ctx).floatFormat;
    local_2b0 = &local_4e8->m_status;
    local_2b8 = sVar17 + (sVar17 == 0);
    lVar21 = 0;
    uVar19 = 0;
    local_460 = 0;
    do {
      local_458._0_8_ = local_458._0_8_ & 0xffffffffffffff00;
      local_458.m_lo = INFINITY;
      local_458.m_hi = -INFINITY;
      if ((uVar19 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_4e8->super_TestCase).super_TestNode.m_testCtx);
      }
      fVar1 = (local_4d0->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19];
      dVar23 = (double)fVar1;
      oVar6 = (ostringstream)NAN(fVar1);
      dStack_430 = INFINITY;
      if (!(bool)oVar6) {
        dStack_430 = dVar23;
      }
      aStack_428._M_allocated_capacity = (size_type)-INFINITY;
      if (!(bool)oVar6) {
        aStack_428._M_allocated_capacity = (size_type)dVar23;
      }
      local_438[0] = oVar6;
      tcu::FloatFormat::roundOut((Interval *)local_4c0,local_4c8,(Interval *)local_438,false);
      tcu::FloatFormat::convert((Interval *)local_1a8,local_4c8,(Interval *)local_4c0);
      pIVar15 = Environment::lookup<float>
                          ((Environment *)&local_2a8,
                           (local_4e0->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      pIVar15->m_hi = (double)local_1a8[0].field_2._0_8_;
      *(pointer *)pIVar15 = local_1a8[0]._M_dataplus._M_p;
      pIVar15->m_lo = (double)local_1a8[0]._M_string_length;
      fVar1 = (local_4d0->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19];
      dVar23 = (double)fVar1;
      local_438[0] = (ostringstream)NAN(fVar1);
      dStack_430 = INFINITY;
      if (!(bool)local_438[0]) {
        dStack_430 = dVar23;
      }
      aStack_428._M_allocated_capacity = (size_type)-INFINITY;
      if (!(bool)local_438[0]) {
        aStack_428._M_allocated_capacity = (size_type)dVar23;
      }
      tcu::FloatFormat::roundOut((Interval *)local_4c0,local_4c8,(Interval *)local_438,false);
      tcu::FloatFormat::convert((Interval *)local_1a8,local_4c8,(Interval *)local_4c0);
      pIVar15 = Environment::lookup<float>
                          ((Environment *)&local_2a8,
                           (local_4e0->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      pVVar20 = local_4e0;
      pIVar15->m_hi = (double)local_1a8[0].field_2._0_8_;
      *(pointer *)pIVar15 = local_1a8[0]._M_dataplus._M_p;
      pIVar15->m_lo = (double)local_1a8[0]._M_string_length;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2a8,
                 (local_4e0->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2a8,
                 (pVVar20->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_410.basic.type = (local_4e8->m_ctx).precision;
      local_418 = local_4c8->m_maxValue;
      local_438 = *(undefined1 (*) [8])local_4c8;
      dStack_430 = *(double *)&local_4c8->m_fractionBits;
      aStack_428._M_allocated_capacity = *(undefined8 *)&local_4c8->m_hasInf;
      aStack_428._8_8_ = *(undefined8 *)&local_4c8->m_exactPrecision;
      local_400 = 0;
      local_410._8_8_ = &local_2a8;
      (*local_490->_vptr_Statement[3])(local_490,(MessageBuilder *)local_438);
      pIVar15 = Environment::lookup<float>
                          ((Environment *)&local_2a8,
                           (local_4e0->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      tcu::FloatFormat::convert((Interval *)local_438,&local_248,pIVar15);
      local_458.m_hi = (double)aStack_428._M_allocated_capacity;
      local_458._0_8_ = local_438;
      uVar11 = local_458._0_8_;
      local_458.m_lo = dStack_430;
      fVar1 = local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19];
      dVar22 = (double)fVar1;
      dVar23 = dVar22;
      if (NAN(fVar1)) {
        dVar23 = INFINITY;
        dVar22 = -INFINITY;
      }
      IVar18 = (IVal)(dVar22 <= (double)aStack_428._M_allocated_capacity && dStack_430 <= dVar23);
      if ((NAN(fVar1)) &&
         (dVar22 <= (double)aStack_428._M_allocated_capacity && dStack_430 <= dVar23)) {
        local_458.m_hasNaN = local_438[0];
        IVar18 = (IVal)local_458.m_hasNaN;
      }
      local_438 = (undefined1  [8])&aStack_428;
      local_458._0_8_ = uVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 0 is outside acceptable range","");
      bVar8 = tcu::ResultCollector::check(local_2b0,(bool)((byte)IVar18 & 1),(string *)local_438);
      if (local_438 != (undefined1  [8])&aStack_428) {
        operator_delete((void *)local_438,aStack_428._M_allocated_capacity + 1);
      }
      if (!bVar8) {
        uVar10 = (int)local_460 + 1;
        local_460 = (ulong)uVar10;
        if ((int)uVar10 < 0x65) {
          local_438 = (undefined1  [8])((local_4e8->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar4 = (local_4e0->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,local_1a8[0]._M_dataplus._M_p,
                     local_1a8[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<float>
                    ((string *)local_4c0,&local_248,
                     (float *)((long)(local_4d0->in0).
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar21));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT71(local_4c0._1_7_,local_4c0[0]),
                     (long)local_4b8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4c0._1_7_,local_4c0[0]) != &aStack_4b0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_4c0._1_7_,local_4c0[0]),
                            (ulong)(aStack_4b0._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar4 = (local_4e0->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,local_1a8[0]._M_dataplus._M_p,
                     local_1a8[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<float>
                    ((string *)local_4c0,&local_248,
                     (float *)((long)(local_4d0->in1).
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar21));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT71(local_4c0._1_7_,local_4c0[0]),
                     (long)local_4b8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4c0._1_7_,local_4c0[0]) != &aStack_4b0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_4c0._1_7_,local_4c0[0]),
                            (ulong)(aStack_4b0._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar4 = (local_4e0->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,local_1a8[0]._M_dataplus._M_p,
                     local_1a8[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<float>
                    ((string *)local_4c0,&local_248,
                     (float *)((long)local_278.out0.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar21));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT71(local_4c0._1_7_,local_4c0[0]),
                     (long)local_4b8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,"\tExpected range: ",0x11);
          intervalToString<float>(&local_488,&local_248,&local_458);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,local_488._M_dataplus._M_p,local_488._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p != &local_488.field_2) {
            operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4c0._1_7_,local_4c0[0]) != &aStack_4b0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_4c0._1_7_,local_4c0[0]),
                            (ulong)(aStack_4b0._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
          std::ios_base::~ios_base(local_3c0);
        }
      }
      uVar19 = uVar19 + 1;
      lVar21 = lVar21 + 4;
    } while (local_2b8 != uVar19);
    iVar9 = (int)local_460;
    if (iVar9 < 0x65) {
      if (iVar9 == 0) goto LAB_007b4a15;
    }
    else {
      local_438 = (undefined1  [8])((local_4e8->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_430,iVar9 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
      std::ios_base::~ios_base(local_3c0);
    }
    local_438 = (undefined1  [8])((local_4e8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
    std::ostream::operator<<((ostringstream *)&dStack_430,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_278.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}